

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  size_type sVar1;
  ulong uVar2;
  size_t __n;
  pointer __dest;
  EVP_PKEY_CTX *__src;
  EVP_PKEY_CTX *ctx;
  ulong n;
  long lVar3;
  
  __src = (EVP_PKEY_CTX *)(this->data_ + this->len);
  if (this->len != this->cap) {
    *__src = (EVP_PKEY_CTX)*args;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len != 0x7fffffffffffffff) {
    n = this->len + 1;
    uVar2 = this->cap;
    if (n < uVar2 * 2) {
      n = uVar2 * 2;
    }
    if (0x7fffffffffffffff - uVar2 < uVar2) {
      n = 0x7fffffffffffffff;
    }
    lVar3 = (long)__src - (long)this->data_;
    __dest = (pointer)operator_new(n);
    __dest[lVar3] = *args;
    ctx = (EVP_PKEY_CTX *)this->data_;
    __n = this->len;
    if (ctx + (__n - (long)__src) == (EVP_PKEY_CTX *)0x0) {
      if (__n != 0) {
        memmove(__dest,ctx,__n);
      }
    }
    else {
      if (ctx != __src) {
        memmove(__dest,ctx,(long)__src - (long)ctx);
      }
      memcpy(__dest + lVar3 + 1,__src,(size_t)(ctx + (__n - (long)__src)));
      ctx = __src;
    }
    cleanup(this,ctx);
    this->len = this->len + 1;
    this->cap = n;
    this->data_ = __dest;
    return __dest + lVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }